

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_results.hpp
# Opt level: O0

const_iterator * __thiscall
asio::ip::basic_resolver_results<asio::ip::tcp>::begin(basic_resolver_results<asio::ip::tcp> *this)

{
  basic_resolver_iterator<asio::ip::tcp> *in_RDI;
  basic_resolver_results<asio::ip::tcp> tmp;
  basic_resolver_iterator<asio::ip::tcp> *in_stack_ffffffffffffffa8;
  
  basic_resolver_results
            ((basic_resolver_results<asio::ip::tcp> *)in_RDI,
             (basic_resolver_results<asio::ip::tcp> *)in_stack_ffffffffffffffa8);
  basic_resolver_iterator<asio::ip::tcp>::basic_resolver_iterator(in_RDI,in_stack_ffffffffffffffa8);
  ~basic_resolver_results((basic_resolver_results<asio::ip::tcp> *)0x1255d3);
  return in_RDI;
}

Assistant:

const_iterator begin() const
  {
    basic_resolver_results tmp(*this);
    tmp.index_ = 0;
    return tmp;
  }